

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask27_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x1b | uVar1;
  uVar2 = uVar2 >> 5;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0x16 | uVar2;
  uVar1 = uVar1 >> 10;
  out[2] = uVar1;
  uVar2 = in[3];
  out[2] = uVar2 << 0x11 | uVar1;
  uVar2 = uVar2 >> 0xf;
  out[3] = uVar2;
  uVar1 = in[4];
  out[3] = uVar1 << 0xc | uVar2;
  uVar1 = uVar1 >> 0x14;
  out[4] = uVar1;
  uVar2 = in[5];
  out[4] = uVar2 << 7 | uVar1;
  uVar2 = uVar2 >> 0x19;
  out[5] = uVar2;
  uVar2 = in[6] << 2 | uVar2;
  out[5] = uVar2;
  uVar1 = in[7];
  out[5] = uVar1 << 0x1d | uVar2;
  out[6] = uVar1 >> 3;
  return out + 7;
}

Assistant:

uint32_t *__fastpackwithoutmask27_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (27 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (27 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (27 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (27 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++out;
  *out = ((*in)) >> (27 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (27 - 24);
  ++in;

  return out + 1;
}